

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O2

void TTD::NSSnapObjects::AssertSnapEquiv
               (SnapObject *sobj1,SnapObject *sobj2,TTDCompareMap *compareMap)

{
  char16_t *string1;
  char16_t *string2;
  SnapHandler *pSVar1;
  TTDVar v1;
  TTDVar v2;
  int iVar2;
  int *piVar3;
  uint32 i;
  ulong uVar4;
  bool bVar5;
  bool bVar6;
  undefined1 auStack_98 [8];
  BaseDictionary<long,_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  sobj1PidMap;
  int64 local_48;
  int64 locationTag;
  SnapHandlerPropertyEntry local_38;
  SnapHandlerPropertyEntry spe;
  
  TTDCompareMap::DiagnosticAssert(compareMap,sobj1->SnapObjectTag == sobj2->SnapObjectTag);
  string1 = sobj1->OptWellKnownToken;
  string2 = sobj2->OptWellKnownToken;
  bVar5 = true;
  bVar6 = true;
  if (string1 != string2) {
    if (string2 == (char16_t *)0x0 || string1 == (char16_t *)0x0) {
      bVar6 = false;
    }
    else {
      iVar2 = PAL_wcscmp(string1,string2);
      bVar6 = iVar2 == 0;
    }
  }
  TTDCompareMap::DiagnosticAssert(compareMap,bVar6);
  NSSnapType::AssertSnapEquiv(sobj1->SnapType,sobj2->SnapType,compareMap);
  if (sobj1->OptDependsOnInfo != (DependsOnInfo *)0x0 ||
      sobj2->OptDependsOnInfo != (DependsOnInfo *)0x0) {
    bVar5 = sobj1->OptDependsOnInfo->DepOnCount == sobj2->OptDependsOnInfo->DepOnCount;
  }
  TTDCompareMap::DiagnosticAssert(compareMap,bVar5);
  if (compareMap->StrictCrossSite == true) {
    bVar6 = sobj1->IsCrossSite == sobj2->IsCrossSite;
  }
  else if (sobj1->IsCrossSite == 0) {
    bVar6 = true;
  }
  else {
    bVar6 = sobj2->IsCrossSite != 0;
  }
  TTDCompareMap::DiagnosticAssert(compareMap,bVar6);
  bVar6 = Js::DynamicType::Is(sobj1->SnapType->JsTypeId);
  bVar5 = Js::DynamicType::Is(sobj2->SnapType->JsTypeId);
  TTDCompareMap::DiagnosticAssert(compareMap,bVar5 == bVar6);
  bVar6 = Js::DynamicType::Is(sobj1->SnapType->JsTypeId);
  if (bVar6) {
    TTDCompareMap::CheckConsistentAndAddPtrIdMapping_Special
              (compareMap,sobj1->OptIndexedObjectArray,sobj2->OptIndexedObjectArray,
               L"indexedObjectArray");
    pSVar1 = sobj1->SnapType->TypeHandlerInfo;
    auStack_98 = (undefined1  [8])0x0;
    sobj1PidMap.buckets = (Type)0x0;
    sobj1PidMap.entries = (Type)&Memory::HeapAllocator::Instance;
    sobj1PidMap.alloc = (Type)0x0;
    sobj1PidMap.size = 0;
    sobj1PidMap.count = 0;
    sobj1PidMap.freeList = 0x4b;
    sobj1PidMap.freeCount = 0;
    sobj1PidMap.modFunctionIndex = 0;
    for (uVar4 = 0; uVar4 < pSVar1->MaxPropertyIndex; uVar4 = uVar4 + 1) {
      local_38 = pSVar1->PropertyInfoArray[uVar4];
      if (local_38.DataKind != Clear) {
        local_48 = NSSnapType::ComputeLocationTagForAssertCompare(&local_38);
        locationTag._4_4_ = (undefined4)uVar4;
        JsUtil::
        BaseDictionary<long,int,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
        ::
        Insert<(JsUtil::BaseDictionary<long,int,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                  ((BaseDictionary<long,int,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                    *)auStack_98,&local_48,(int *)((long)&locationTag + 4));
      }
    }
    pSVar1 = sobj2->SnapType->TypeHandlerInfo;
    for (uVar4 = 0; uVar4 < pSVar1->MaxPropertyIndex; uVar4 = uVar4 + 1) {
      local_38 = pSVar1->PropertyInfoArray[uVar4];
      if (((ulong)local_38 & 0xfe00000000) != 0) {
        local_48 = NSSnapType::ComputeLocationTagForAssertCompare(&local_38);
        locationTag._4_4_ = 0xffffffff;
        piVar3 = JsUtil::
                 BaseDictionary<long,_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 ::LookupWithKey<long>
                           ((BaseDictionary<long,_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                             *)auStack_98,&local_48,(int *)((long)&locationTag + 4));
        iVar2 = *piVar3;
        TTDCompareMap::DiagnosticAssert(compareMap,(long)iVar2 != -1);
        v1 = sobj1->VarArray[iVar2];
        v2 = sobj2->VarArray[uVar4];
        if (local_38.DataKind == Setter) {
          NSSnapValues::AssertSnapEquivTTDVar_PropertySetter
                    (v1,v2,compareMap,local_38.PropertyRecordId);
        }
        else if (local_38.DataKind == Getter) {
          NSSnapValues::AssertSnapEquivTTDVar_PropertyGetter
                    (v1,v2,compareMap,local_38.PropertyRecordId);
        }
        else {
          if (local_38.DataKind != Data) {
            TTDAbort_unrecoverable_error("What other tags are there???");
          }
          NSSnapValues::AssertSnapEquivTTDVar_Property(v1,v2,compareMap,local_38.PropertyRecordId);
        }
      }
    }
    JsUtil::
    BaseDictionary<long,_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::~BaseDictionary((BaseDictionary<long,_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                       *)auStack_98);
  }
  if (compareMap->SnapObjCmpVTable[(int)sobj1->SnapObjectTag] != (fPtr_AssertSnapEquivAddtlInfo)0x0)
  {
    (*compareMap->SnapObjCmpVTable[(int)sobj1->SnapObjectTag])(sobj1,sobj2,compareMap);
  }
  return;
}

Assistant:

void AssertSnapEquiv(const SnapObject* sobj1, const SnapObject* sobj2, TTDCompareMap& compareMap)
        {
            compareMap.DiagnosticAssert(sobj1->SnapObjectTag == sobj2->SnapObjectTag);
            compareMap.DiagnosticAssert(TTD_DIAGNOSTIC_COMPARE_WELLKNOWN_TOKENS(sobj1->OptWellKnownToken, sobj2->OptWellKnownToken));

            NSSnapType::AssertSnapEquiv(sobj1->SnapType, sobj2->SnapType, compareMap);

            //Depends on info is a function of the rest of the properties so we don't need to explicitly check it.
            //But for sanity assert same counts.
            compareMap.DiagnosticAssert((sobj1->OptDependsOnInfo == nullptr && sobj2->OptDependsOnInfo == nullptr) || (sobj1->OptDependsOnInfo->DepOnCount == sobj2->OptDependsOnInfo->DepOnCount));

            //we allow the replay in debug mode to be cross site even if orig was not (that is ok) but if record was x-site then replay must be as well
            if(compareMap.StrictCrossSite)
            {
                compareMap.DiagnosticAssert(sobj1->IsCrossSite == sobj2->IsCrossSite);
            }
            else
            {
                compareMap.DiagnosticAssert(!sobj1->IsCrossSite || sobj2->IsCrossSite);
            }

#if ENABLE_OBJECT_SOURCE_TRACKING
            compareMap.DiagnosticAssert(sobj1->DiagOriginInfo.SourceLine == sobj2->DiagOriginInfo.SourceLine);
            compareMap.DiagnosticAssert(sobj1->DiagOriginInfo.EventTime == sobj2->DiagOriginInfo.EventTime);
            compareMap.DiagnosticAssert(sobj1->DiagOriginInfo.TimeHash == sobj2->DiagOriginInfo.TimeHash);
#endif

            compareMap.DiagnosticAssert(Js::DynamicType::Is(sobj1->SnapType->JsTypeId) == Js::DynamicType::Is(sobj2->SnapType->JsTypeId));
            if(Js::DynamicType::Is(sobj1->SnapType->JsTypeId))
            {
                compareMap.CheckConsistentAndAddPtrIdMapping_Special(sobj1->OptIndexedObjectArray, sobj2->OptIndexedObjectArray, _u("indexedObjectArray"));

                const NSSnapType::SnapHandler* handler1 = sobj1->SnapType->TypeHandlerInfo;
                JsUtil::BaseDictionary<int64, int32, HeapAllocator> sobj1PidMap(&HeapAllocator::Instance);
                for(uint32 i = 0; i < handler1->MaxPropertyIndex; ++i)
                {
                    const NSSnapType::SnapHandlerPropertyEntry spe = handler1->PropertyInfoArray[i];
                    if(spe.DataKind != NSSnapType::SnapEntryDataKindTag::Clear)
                    {
                        int64 locationTag = ComputeLocationTagForAssertCompare(spe);
                        sobj1PidMap.AddNew(locationTag, (int32)i);
                    }
                }

                const NSSnapType::SnapHandler* handler2 = sobj2->SnapType->TypeHandlerInfo;
                for(uint32 i = 0; i < handler2->MaxPropertyIndex; ++i)
                {
                    const NSSnapType::SnapHandlerPropertyEntry spe = handler2->PropertyInfoArray[i];
                    if(spe.DataKind != NSSnapType::SnapEntryDataKindTag::Clear && spe.DataKind != NSSnapType::SnapEntryDataKindTag::Uninitialized)
                    {
                        int64 locationTag = ComputeLocationTagForAssertCompare(spe);

                        int32 idx1 = sobj1PidMap.LookupWithKey(locationTag, -1);
                        compareMap.DiagnosticAssert(idx1 != -1);

                        TTDVar var1 = sobj1->VarArray[idx1];
                        TTDVar var2 = sobj2->VarArray[i];

                        if(spe.DataKind == NSSnapType::SnapEntryDataKindTag::Data)
                        {
                            NSSnapValues::AssertSnapEquivTTDVar_Property(var1, var2, compareMap, spe.PropertyRecordId);
                        }
                        else if(spe.DataKind == NSSnapType::SnapEntryDataKindTag::Getter)
                        {
                            NSSnapValues::AssertSnapEquivTTDVar_PropertyGetter(var1, var2, compareMap, spe.PropertyRecordId);
                        }
                        else
                        {
                            TTDAssert(spe.DataKind == NSSnapType::SnapEntryDataKindTag::Setter, "What other tags are there???");

                            NSSnapValues::AssertSnapEquivTTDVar_PropertySetter(var1, var2, compareMap, spe.PropertyRecordId);
                        }
                    }
                }
            }

            fPtr_AssertSnapEquivAddtlInfo equivCheck = compareMap.SnapObjCmpVTable[(int32)sobj1->SnapObjectTag];
            if(equivCheck != nullptr)
            {
                equivCheck(sobj1, sobj2, compareMap);
            }
        }